

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O0

wchar_t borg_new_take(object_kind *kind,wchar_t y,wchar_t x)

{
  borg_grid *pbVar1;
  chunk_conflict *c;
  _Bool _Var2;
  uint32_t uVar3;
  loc_conflict grid;
  object *obj;
  borg_take *pbVar4;
  char *pcVar5;
  object *o_ptr;
  borg_grid *ag;
  borg_take *take;
  wchar_t n;
  wchar_t i;
  wchar_t x_local;
  wchar_t y_local;
  object_kind *kind_local;
  
  c = cave;
  take._0_4_ = L'\xffffffff';
  pbVar1 = borg_grids[y];
  grid = (loc_conflict)loc(x,y);
  obj = borg_get_top_object((chunk *)c,grid);
  for (take._4_4_ = L'\x01'; (wchar_t)take < L'\0' && take._4_4_ < borg_takes_nxt;
      take._4_4_ = take._4_4_ + L'\x01') {
    if (borg_takes[take._4_4_].kind == (object_kind *)0x0) {
      take._0_4_ = take._4_4_;
    }
  }
  if (((wchar_t)take < L'\0') && (borg_takes_nxt < 0x100)) {
    take._0_4_ = (wchar_t)borg_takes_nxt;
    borg_takes_nxt = borg_takes_nxt + 1;
  }
  if ((wchar_t)take < L'\0') {
    borg_note("# Too many objects");
    uVar3 = Rand_div((int)borg_takes_nxt - 1);
    take._0_4_ = uVar3 + L'\x01';
    borg_delete_take((wchar_t)take);
  }
  borg_takes_cnt = borg_takes_cnt + 1;
  pbVar4 = borg_takes + (wchar_t)take;
  pbVar4->kind = kind;
  pbVar4->tval = kind->tval;
  pbVar4->x = (uint8_t)x;
  pbVar4->y = (uint8_t)y;
  pbVar1[x].take = (uint8_t)(wchar_t)take;
  pbVar4->when = borg_t;
  pbVar4->orbed = false;
  if ((kind->aware & 1U) == 0) {
    pbVar4->value = L'\x01';
  }
  else {
    pbVar4->value = kind->cost;
    if (pbVar4->tval == L'#') {
      pbVar4->value = L'\x1e';
    }
  }
  _Var2 = object_fully_known(obj);
  if ((_Var2) && (((obj->to_a < 0 || (obj->to_d < 0)) || (obj->to_h < 0)))) {
    pbVar4->value = L'\xfffffff6';
  }
  if (obj->note != 0) {
    pcVar5 = quark_str(obj->note);
    _Var2 = prefix(pcVar5,"borg ignore");
    if (_Var2) {
      pbVar4->value = L'\xfffffff6';
    }
  }
  pcVar5 = format("# Creating an object \'%s\' at (%d,%d)",pbVar4->kind->name,(ulong)pbVar4->x,
                  (ulong)pbVar4->y);
  borg_note(pcVar5);
  if (borg.trait[0x1a] != 0) {
    borg.goal.type = 0;
  }
  pbVar1[x].feat = '\x01';
  return (wchar_t)take;
}

Assistant:

static int borg_new_take(struct object_kind *kind, int y, int x)
{
    int i, n = -1;

    borg_take *take;

    borg_grid *ag        = &borg_grids[y][x];

    struct object *o_ptr = borg_get_top_object(cave, loc(x, y));

    /* Look for a "dead" object */
    for (i = 1; (n < 0) && (i < borg_takes_nxt); i++) {
        /* Reuse "dead" objects */
        if (!borg_takes[i].kind)
            n = i;
    }

    /* Allocate a new object */
    if ((n < 0) && (borg_takes_nxt < 256)) {
        /* Acquire the entry, advance */
        n = borg_takes_nxt++;
    }

    /* Hack -- steal an old object */
    if (n < 0) {
        /* Note */
        borg_note("# Too many objects");

        /* Hack -- Pick a random object */
        n = randint0(borg_takes_nxt - 1) + 1;

        /* Delete it */
        borg_delete_take(n);
    }

    /* Count new object */
    borg_takes_cnt++;

    /* Obtain the object */
    take = &borg_takes[n];

    /* Save the kind */
    take->kind = kind;
    take->tval = kind->tval;

    /* Save the location */
    take->x = x;
    take->y = y;

    /* Save the index */
    ag->take = n;

    /* Timestamp */
    take->when = borg_t;

    /* Not had Orb of Draining cast on it */
    take->orbed = false;

    /* Assess a estimated value */
    if (kind->aware) {
        /* Standard Value of an item */
        take->value = kind->cost;

        /* Money needs a value */
        if (take->tval == TV_GOLD)
            take->value = 30;
    } else {
        take->value = 1;
    }

    /* Cheat to see if this item is ID'd or not.  We use this cheat to avoid
     * dumping an item which we know to be bad then turning around and picking
     * it up again.
     */
    if (object_fully_known(o_ptr)
        && (o_ptr->to_a < 0 || o_ptr->to_d < 0 || o_ptr->to_h < 0))
        take->value = -10;

    if (o_ptr->note && prefix(quark_str(o_ptr->note), "borg ignore"))
        take->value = -10;

    /* Note */
    borg_note(format("# Creating an object '%s' at (%d,%d)", (take->kind->name),
        take->x, take->y));

    /* Wipe goals only if I have some light source */
    if (borg.trait[BI_LIGHT])
        borg.goal.type = 0;

    /* Hack -- Force the object to sit on a floor grid */
    ag->feat = FEAT_FLOOR;

    /* Result */
    return n;
}